

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O0

void __thiscall
Args::Arg::Arg<char_const(&)[5]>
          (Arg *this,Char flag,char (*name) [5],bool isWithValue,bool isRequired)

{
  byte in_CL;
  ArgIface *in_RDI;
  byte in_R8B;
  String *in_stack_ffffffffffffff98;
  String *in_stack_ffffffffffffffa0;
  
  ArgIface::ArgIface(in_RDI);
  in_RDI->_vptr_ArgIface = (_func_int **)&PTR__Arg_00131858;
  *(byte *)&in_RDI[1]._vptr_ArgIface = in_CL & 1;
  *(byte *)((long)&in_RDI[1]._vptr_ArgIface + 1) = in_R8B & 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ArgIface + 2) = 0;
  String::String((String *)0x10db39);
  String::String(in_stack_ffffffffffffff98,0,
                 (Char)(char16_t)((ulong)in_stack_ffffffffffffffa0 >> 0x30));
  String::String(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  String::String(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  String::String((String *)0x10dbad);
  String::String((String *)0x10dbc4);
  String::String((String *)0x10dbd7);
  return;
}

Assistant:

Arg::Arg( Char flag, T && name,
	bool isWithValue, bool isRequired )
	:	m_isWithValue( isWithValue )
	,	m_isRequired( isRequired )
	,	m_isDefined( false )
	,	m_flag( 1, flag )
	,	m_name( std::forward< T > ( name ) )
	,	m_valueSpecifier( SL( "arg" ) )
{
}